

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall
edition_unittest::TestPackedExtensions::~TestPackedExtensions(TestPackedExtensions *this)

{
  SharedDtor((MessageLite *)this);
  return;
}

Assistant:

TestPackedExtensions::~TestPackedExtensions() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestPackedExtensions)
  SharedDtor(*this);
}